

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

QAbstractItemView * __thiscall
QAccessibleCalendarWidget::calendarView(QAccessibleCalendarWidget *this)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  QAbstractItemView *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QLatin1String QVar8;
  QArrayData *local_50;
  storage_type_conflict *local_48;
  long local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  lVar2 = *(long *)(*(long *)(lVar4 + 8) + 0x28);
  if (lVar2 != 0) {
    lVar4 = *(long *)(*(long *)(lVar4 + 8) + 0x20);
    lVar6 = 0;
    do {
      pQVar5 = *(QAbstractItemView **)(lVar4 + lVar6);
      QObject::objectName();
      if (local_40 == 0x18) {
        QVar7.m_data = local_48;
        QVar7.m_size = 0x18;
        QVar8.m_data = "qt_calendar_calendarview";
        QVar8.m_size = 0x18;
        cVar3 = QtPrivate::equalStrings(QVar7,QVar8);
      }
      else {
        cVar3 = '\0';
      }
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      if (cVar3 != '\0') goto LAB_00527fbb;
      lVar6 = lVar6 + 8;
    } while (lVar2 << 3 != lVar6);
  }
  pQVar5 = (QAbstractItemView *)0x0;
LAB_00527fbb:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractItemView *QAccessibleCalendarWidget::calendarView() const
{
    for (QObject *child : calendarWidget()->children()) {
        if (child->objectName() == "qt_calendar_calendarview"_L1)
            return static_cast<QAbstractItemView *>(child);
    }
    return nullptr;
}